

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void calc_ranges_all_cols<InputData<float,int>,WorkerMemory<ImputedData<int,long_double>,long_double,float>>
               (InputData<float,_int> *input_data,
               WorkerMemory<ImputedData<int,_long_double>,_long_double,_float> *workspace,
               ModelParams *model_params,double *ranges,double *saved_xmin,double *saved_xmax)

{
  bool bVar1;
  ColumnSampler<long_double> *in_RCX;
  long in_RSI;
  long in_RDI;
  ColumnSampler<long_double> *in_R8;
  ColumnSampler<long_double> *in_R9;
  pointer puVar2;
  size_t in_stack_ffffffffffffffc8;
  
  ColumnSampler<long_double>::prepare_full_pass(in_RCX);
  while (bVar1 = ColumnSampler<long_double>::sample_col(in_R8,(size_t *)in_R9), bVar1) {
    get_split_range<InputData<float,int>,WorkerMemory<ImputedData<int,long_double>,long_double,float>>
              ((WorkerMemory<ImputedData<int,_long_double>,_long_double,_float> *)model_params,
               (InputData<float,_int> *)ranges,(ModelParams *)saved_xmin);
    if ((*(byte *)(in_RSI + 0x108) & 1) == 0) {
      (&(in_RCX->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] =
           (pointer)(*(double *)(in_RSI + 0xf8) - *(double *)(in_RSI + 0xf0));
      if (*(long *)(in_RSI + 0x4e8) == 0) {
        if (*(long *)(in_RDI + 0x50) != 0) {
          (&(in_RCX->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] =
               (pointer)((double)*(float *)(*(long *)(in_RDI + 0x50) + *(long *)(in_RSI + 0x518) * 4
                                           ) *
                        (double)(&(in_RCX->col_indices).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start)
                                [*(long *)(in_RSI + 0x518)]);
          puVar2 = (&(in_RCX->col_indices).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)];
          if ((double)puVar2 <= 1e-100) {
            puVar2 = (pointer)0x2b2bff2ee48e0530;
          }
          (&(in_RCX->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] = puVar2;
        }
      }
      else {
        (&(in_RCX->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] =
             (pointer)(*(double *)(*(long *)(in_RSI + 0x4e8) + *(long *)(in_RSI + 0x518) * 8) *
                      (double)(&(in_RCX->col_indices).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)]
                      );
        puVar2 = (&(in_RCX->col_indices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)];
        if ((double)puVar2 <= 1e-100) {
          puVar2 = (pointer)0x2b2bff2ee48e0530;
        }
        (&(in_RCX->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] = puVar2;
      }
      if (in_R8 != (ColumnSampler<long_double> *)0x0) {
        (&(in_R8->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] =
             *(pointer *)(in_RSI + 0xf0);
        (&(in_R9->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] =
             *(pointer *)(in_RSI + 0xf8);
      }
    }
    else {
      ColumnSampler<long_double>::drop_col(in_R9,in_stack_ffffffffffffffc8);
      (&(in_RCX->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] = (pointer)0x0;
      if (in_R8 != (ColumnSampler<long_double> *)0x0) {
        (&(in_R8->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] = (pointer)0x0;
        (&(in_R9->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start)[*(long *)(in_RSI + 0x518)] = (pointer)0x0;
      }
    }
  }
  return;
}

Assistant:

void calc_ranges_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                          double *restrict ranges, double *restrict saved_xmin, double *restrict saved_xmax)
{
    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        get_split_range(workspace, input_data, model_params);

        if (workspace.unsplittable) {
            workspace.col_sampler.drop_col(workspace.col_chosen);
            ranges[workspace.col_chosen] = 0;
            if (saved_xmin != NULL) {
                saved_xmin[workspace.col_chosen] = 0;
                saved_xmax[workspace.col_chosen] = 0;
            }
        }
        else {
            ranges[workspace.col_chosen] = workspace.xmax - workspace.xmin;
            if (workspace.tree_kurtoses != NULL) {
                ranges[workspace.col_chosen] *= workspace.tree_kurtoses[workspace.col_chosen];
                ranges[workspace.col_chosen] = std::fmax(ranges[workspace.col_chosen], 1e-100);
            }
            else if (input_data.col_weights != NULL) {
                ranges[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
                ranges[workspace.col_chosen] = std::fmax(ranges[workspace.col_chosen], 1e-100);
            }
            if (saved_xmin != NULL) {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }
        }
    }
}